

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O2

void __thiscall Edge::initWithObs(Edge *this,Vector2d *obs)

{
  _Elt_pointer pMVar1;
  PointerType ptr_1;
  _Elt_pointer pMVar2;
  size_type sVar3;
  reference pvVar4;
  PointerType ptr;
  size_type __n;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pMVar1 = (this->
           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ).
           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pMVar2 = (this->
           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ).
           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  dVar6 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar8 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  dVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0] - dVar6;
  dVar7 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1] - dVar8;
  if (pMVar2 == (this->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pMVar2 = (this->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  dVar6 = pMVar2[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] - dVar6;
  dVar8 = pMVar2[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] - dVar8;
  sVar3 = std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size(&this->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                );
  dVar5 = SQRT(dVar7 * dVar7 + dVar5 * dVar5);
  dVar6 = SQRT(dVar8 * dVar8 + dVar6 * dVar6);
  if (dVar5 <= dVar6) {
    dVar6 = dVar5;
  }
  this->min_dist = dVar6;
  for (__n = 1; (long)__n < (long)((int)sVar3 + -1); __n = __n + 1) {
    pvVar4 = std::
             deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::at(&this->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ,__n);
    dVar6 = (pvVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[0] -
            (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[0];
    dVar8 = (pvVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1] -
            (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
    dVar8 = SQRT(dVar8 * dVar8 + dVar6 * dVar6);
    dVar6 = this->min_dist;
    if (dVar8 <= this->min_dist) {
      dVar6 = dVar8;
    }
    this->min_dist = dVar6;
  }
  this->valid = true;
  return;
}

Assistant:

void Edge::initWithObs(Eigen::Vector2d obs) {
    LOG_CHECK("Init with obs, this address is: %x, size is %lu", this, this->size());
    Eigen::Vector2d front_beam = this->front().block<2, 1>(0, 0) - obs, back_beam = this->back().block<2, 1>(0, 0) - obs;
    int max_size = static_cast<int>(this->size()) - 1;
    min_dist = std::min(front_beam.norm(), back_beam.norm());
    for (int i = 1; i < max_size; i++) {
        Eigen::Vector2d vec = this->at(i).block<2, 1>(0, 0) - obs;
        min_dist = std::min(vec.norm(), min_dist);   
    }
    valid = true;
}